

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

GLFWcursor * glfwCreateStandardCursor(int shape)

{
  wchar_t wVar1;
  _GLFWcursor *cursor;
  
  if (_glfwInitialized == '\0') {
    cursor = (_GLFWcursor *)0x0;
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    cursor = (_GLFWcursor *)calloc(1,0x10);
    cursor->next = _glfw.cursorListHead;
    _glfw.cursorListHead = cursor;
    wVar1 = _glfwPlatformCreateStandardCursor(cursor,shape);
    if (wVar1 == L'\0') {
      glfwDestroyCursor((GLFWcursor *)cursor);
      cursor = (_GLFWcursor *)0x0;
    }
  }
  return (GLFWcursor *)cursor;
}

Assistant:

GLFWAPI GLFWcursor* glfwCreateStandardCursor(int shape)
{
    _GLFWcursor* cursor;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    cursor = calloc(1, sizeof(_GLFWcursor));
    cursor->next = _glfw.cursorListHead;
    _glfw.cursorListHead = cursor;

    if (!_glfwPlatformCreateStandardCursor(cursor, shape))
    {
        glfwDestroyCursor((GLFWcursor*) cursor);
        return NULL;
    }

    return (GLFWcursor*) cursor;
}